

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

bool __thiscall amrex::Box::coarsenable(Box *this,IntVect *refrat,IntVect *min_width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  int *in_RDX;
  int *in_RSI;
  Box *in_RDI;
  bool bVar6;
  IntVect IVar7;
  Box testBox;
  int dir;
  IntVect off;
  IntVect shft;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  int local_500;
  int local_4fc;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_494;
  int local_490;
  int local_48c;
  int local_484;
  int local_480;
  int local_47c;
  int local_474;
  int local_470;
  int local_46c;
  bool local_42d;
  Box local_42c;
  int local_410 [2];
  int local_408;
  int local_3fc;
  int iStack_3f8;
  int local_3f4;
  int local_3f0 [3];
  undefined8 local_3e0;
  int local_3d8;
  int *local_3d0;
  int *local_3c8;
  bool local_3b1;
  int *local_3b0;
  undefined8 *local_3a8;
  undefined4 local_39c;
  int *local_398;
  undefined4 local_38c;
  int *local_388;
  undefined4 local_37c;
  int *local_378;
  int local_370;
  IntVect local_36c;
  int *local_360;
  Box *local_358;
  int local_34c;
  int *local_348;
  int local_33c;
  IntVect *local_338;
  int local_32c;
  IndexType *local_328;
  int local_31c;
  IndexType *local_318;
  int local_310;
  undefined4 local_30c;
  int *local_308;
  int *local_300;
  IntVect *local_2f8;
  int *local_2f0;
  IntVect *local_2e8;
  int *local_2e0;
  Box *local_2d8;
  IndexType *local_2d0;
  undefined4 local_2c8;
  int local_2c4;
  IntVect *local_2c0;
  IntVect *local_2b8;
  IntVect *local_2b0;
  undefined4 local_2a4;
  IntVect *local_2a0;
  undefined4 local_294;
  IntVect *local_290;
  undefined4 local_284;
  IntVect *local_280;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208 [2];
  int local_200;
  int *local_1f8;
  int *local_1f0;
  IntVect local_1e8;
  undefined4 local_1dc;
  int *local_1d8;
  undefined4 local_1cc;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  int local_1b0 [2];
  int local_1a8;
  int local_1a0;
  int iStack_19c;
  int local_198;
  IntVect local_194;
  int *local_188;
  Box *local_180;
  undefined4 local_174;
  int *local_170;
  IntVect *local_168;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  undefined4 local_134;
  IntVect *local_130;
  IntVect *local_128;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  int *local_e8;
  IntVect *local_e0;
  undefined4 local_d4;
  int *local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  int local_a8 [2];
  int local_a0;
  IndexType *local_98;
  IntVect local_8c;
  int *local_80;
  IntVect *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  int *local_40;
  Box *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_3d0 = in_RDX;
  local_3c8 = in_RSI;
  IVar7 = size((Box *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  local_3f0[2] = IVar7.vect[2];
  local_3d8 = local_3f0[2];
  local_3f0._0_8_ = IVar7.vect._0_8_;
  local_3e0._0_4_ = local_3f0[0];
  local_3e0._4_4_ = local_3f0[1];
  local_1f0 = local_3c8;
  local_1f8 = local_3d0;
  local_1b8 = local_3d0;
  local_1bc = 0;
  local_1c8 = local_3d0;
  local_1cc = 1;
  local_1d8 = local_3d0;
  local_1dc = 2;
  local_3f0 = IVar7.vect;
  IntVect::IntVect(&local_1e8,*local_3c8 * *local_3d0,local_3c8[1] * local_3d0[1],
                   local_3c8[2] * local_3d0[2]);
  local_200 = local_1e8.vect[2];
  local_208[0] = local_1e8.vect[0];
  local_208[1] = local_1e8.vect[1];
  local_408 = local_1e8.vect[2];
  local_410[0] = local_1e8.vect[0];
  local_410[1] = local_1e8.vect[1];
  local_3fc = local_1e8.vect[0];
  iStack_3f8 = local_1e8.vect[1];
  uVar4 = _local_3fc;
  local_3f4 = local_1e8.vect[2];
  local_3a8 = &local_3e0;
  local_3b0 = &local_3fc;
  local_37c = 0;
  local_3fc = local_1e8.vect[0];
  local_42d = false;
  if (local_3fc <= (int)local_3e0) {
    local_38c = 1;
    iStack_3f8 = local_1e8.vect[1];
    local_42d = false;
    local_388 = local_3b0;
    if (iStack_3f8 <= local_3e0._4_4_) {
      local_39c = 2;
      local_42d = local_1e8.vect[2] <= local_3d8;
      local_398 = local_3b0;
    }
  }
  if (local_42d) {
    lVar1 = *(long *)(in_RDI->smallend).vect;
    lVar2 = *(long *)((in_RDI->smallend).vect + 2);
    lVar3 = *(long *)((in_RDI->bigend).vect + 1);
    local_42c.btype.itype = (in_RDI->btype).itype;
    local_358 = &local_42c;
    local_360 = local_3c8;
    local_308 = local_3c8;
    local_30c = 1;
    bVar6 = true;
    if ((*local_3c8 == 1) && (bVar6 = true, local_3c8[1] == 1)) {
      bVar6 = local_3c8[2] != 1;
    }
    local_42c.smallend.vect._0_8_ = lVar1;
    local_42c._8_8_ = lVar2;
    local_42c.bigend.vect._4_8_ = lVar3;
    _local_3fc = uVar4;
    local_378 = local_3b0;
    if (bVar6) {
      local_2e0 = local_3c8;
      local_42c.smallend.vect[0] = (int)lVar1;
      local_258 = local_42c.smallend.vect[0];
      local_25c = *local_3c8;
      local_254 = local_258;
      if (local_25c != 1) {
        if (local_25c == 2) {
          if (local_42c.smallend.vect[0] < 0) {
            iVar5 = local_42c.smallend.vect[0] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_46c = -iVar5 / 2 + -1;
          }
          else {
            local_46c = local_42c.smallend.vect[0] / 2;
          }
          local_254 = local_46c;
        }
        else if (local_25c == 4) {
          if (local_42c.smallend.vect[0] < 0) {
            iVar5 = local_42c.smallend.vect[0] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_470 = -iVar5 / 4 + -1;
          }
          else {
            local_470 = local_42c.smallend.vect[0] / 4;
          }
          local_254 = local_470;
        }
        else {
          if (local_42c.smallend.vect[0] < 0) {
            iVar5 = local_42c.smallend.vect[0] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_474 = -iVar5 / local_25c + -1;
          }
          else {
            local_474 = local_42c.smallend.vect[0] / local_25c;
          }
          local_254 = local_474;
        }
      }
      local_42c.smallend.vect[1] = (int)((ulong)lVar1 >> 0x20);
      local_264 = local_42c.smallend.vect[1];
      local_42c.smallend.vect[0] = local_254;
      local_268 = local_3c8[1];
      local_260 = local_264;
      if (local_268 != 1) {
        if (local_268 == 2) {
          if (lVar1 < 0) {
            iVar5 = local_264 + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_47c = -iVar5 / 2 + -1;
          }
          else {
            local_47c = local_264 / 2;
          }
          local_260 = local_47c;
        }
        else if (local_268 == 4) {
          if (lVar1 < 0) {
            iVar5 = local_264 + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_480 = -iVar5 / 4 + -1;
          }
          else {
            local_480 = local_264 / 4;
          }
          local_260 = local_480;
        }
        else {
          if (lVar1 < 0) {
            iVar5 = local_264 + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_484 = -iVar5 / local_268 + -1;
          }
          else {
            local_484 = local_264 / local_268;
          }
          local_260 = local_484;
        }
      }
      local_42c.smallend.vect[1] = local_260;
      local_42c.smallend.vect[2] = (int)lVar2;
      local_270 = local_42c.smallend.vect[2];
      local_274 = local_3c8[2];
      local_26c = local_270;
      if (local_274 != 1) {
        if (local_274 == 2) {
          if (local_42c.smallend.vect[2] < 0) {
            iVar5 = local_42c.smallend.vect[2] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_48c = -iVar5 / 2 + -1;
          }
          else {
            local_48c = local_42c.smallend.vect[2] / 2;
          }
          local_26c = local_48c;
        }
        else if (local_274 == 4) {
          if (local_42c.smallend.vect[2] < 0) {
            iVar5 = local_42c.smallend.vect[2] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_490 = -iVar5 / 4 + -1;
          }
          else {
            local_490 = local_42c.smallend.vect[2] / 4;
          }
          local_26c = local_490;
        }
        else {
          if (local_42c.smallend.vect[2] < 0) {
            iVar5 = local_42c.smallend.vect[2] + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_494 = -iVar5 / local_274 + -1;
          }
          else {
            local_494 = local_42c.smallend.vect[2] / local_274;
          }
          local_26c = local_494;
        }
      }
      local_42c.bigend.vect[0] = (int)((ulong)lVar2 >> 0x20);
      local_4e4 = local_42c.bigend.vect[0];
      local_42c.smallend.vect[2] = local_26c;
      local_2d0 = &local_42c.btype;
      local_2d8 = local_358;
      if (local_42c.btype.itype == 0) {
        local_2e8 = &local_42c.bigend;
        local_2f0 = local_3c8;
        local_234 = local_4e4;
        local_238 = *local_3c8;
        local_230 = local_234;
        if (local_238 != 1) {
          if (local_238 == 2) {
            if (lVar2 < 0) {
              local_4e4 = local_4e4 + 1;
              if (local_4e4 < 1) {
                local_4e4 = -local_4e4;
              }
              local_4dc = -local_4e4 / 2 + -1;
            }
            else {
              local_4dc = local_4e4 / 2;
            }
            local_230 = local_4dc;
          }
          else if (local_238 == 4) {
            if (lVar2 < 0) {
              local_4e4 = local_4e4 + 1;
              if (local_4e4 < 1) {
                local_4e4 = -local_4e4;
              }
              local_4e0 = -local_4e4 / 4 + -1;
            }
            else {
              local_4e0 = local_4e4 / 4;
            }
            local_230 = local_4e0;
          }
          else {
            if (lVar2 < 0) {
              local_4e4 = local_4e4 + 1;
              if (local_4e4 < 1) {
                local_4e4 = -local_4e4;
              }
              local_4e4 = -local_4e4 / local_238 + -1;
            }
            else {
              local_4e4 = local_4e4 / local_238;
            }
            local_230 = local_4e4;
          }
        }
        local_42c.bigend.vect[0] = local_230;
        local_42c.bigend.vect[1] = (int)lVar3;
        local_240 = local_42c.bigend.vect[1];
        local_244 = local_3c8[1];
        local_23c = local_240;
        if (local_244 != 1) {
          if (local_244 == 2) {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4ec = -iVar5 / 2 + -1;
            }
            else {
              local_4ec = local_42c.bigend.vect[1] / 2;
            }
            local_23c = local_4ec;
          }
          else if (local_244 == 4) {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4f0 = -iVar5 / 4 + -1;
            }
            else {
              local_4f0 = local_42c.bigend.vect[1] / 4;
            }
            local_23c = local_4f0;
          }
          else {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4f4 = -iVar5 / local_244 + -1;
            }
            else {
              local_4f4 = local_42c.bigend.vect[1] / local_244;
            }
            local_23c = local_4f4;
          }
        }
        local_42c.bigend.vect[2] = (int)((ulong)lVar3 >> 0x20);
        local_24c = local_42c.bigend.vect[2];
        local_42c.bigend.vect[1] = local_23c;
        local_250 = local_3c8[2];
        local_248 = local_24c;
        if (local_250 != 1) {
          if (local_250 == 2) {
            if (lVar3 < 0) {
              iVar5 = local_24c + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4fc = -iVar5 / 2 + -1;
            }
            else {
              local_4fc = local_24c / 2;
            }
            local_248 = local_4fc;
          }
          else if (local_250 == 4) {
            if (lVar3 < 0) {
              iVar5 = local_24c + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_500 = -iVar5 / 4 + -1;
            }
            else {
              local_500 = local_24c / 4;
            }
            local_248 = local_500;
          }
          else if (lVar3 < 0) {
            iVar5 = local_24c + 1;
            if (iVar5 < 1) {
              iVar5 = -iVar5;
            }
            local_248 = -iVar5 / local_250 + -1;
          }
          else {
            local_248 = local_24c / local_250;
          }
        }
        local_42c.bigend.vect[2] = local_248;
        local_42c._8_8_ = local_42c._8_8_;
        local_42c.bigend.vect._4_8_ = local_42c.bigend.vect._4_8_;
      }
      else {
        IntVect::IntVect(&local_36c,0);
        uVar4 = local_42c.bigend.vect._4_8_;
        for (local_370 = 0; local_370 < 3; local_370 = local_370 + 1) {
          local_328 = &local_42c.btype;
          local_32c = local_370;
          local_31c = local_370;
          local_310 = local_370;
          if ((local_42c.btype.itype & 1 << ((byte)local_370 & 0x1f)) != 0) {
            local_338 = &local_42c.bigend;
            local_33c = local_370;
            local_348 = local_360;
            local_34c = local_370;
            if (local_338->vect[local_370] % local_360[local_370] != 0) {
              local_2c0 = &local_36c;
              local_2c4 = local_370;
              local_2c8 = 1;
              local_2c0->vect[local_370] = 1;
            }
          }
          local_318 = local_328;
        }
        local_2f8 = &local_42c.bigend;
        local_300 = local_360;
        local_210 = local_42c.bigend.vect[0];
        local_214 = *local_360;
        local_20c = local_210;
        if (local_214 != 1) {
          if (local_214 == 2) {
            if ((long)local_42c._8_8_ < 0) {
              iVar5 = local_42c.bigend.vect[0] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4a4 = -iVar5 / 2 + -1;
            }
            else {
              local_4a4 = local_42c.bigend.vect[0] / 2;
            }
            local_20c = local_4a4;
          }
          else if (local_214 == 4) {
            if ((long)local_42c._8_8_ < 0) {
              iVar5 = local_42c.bigend.vect[0] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4a8 = -iVar5 / 4 + -1;
            }
            else {
              local_4a8 = local_42c.bigend.vect[0] / 4;
            }
            local_20c = local_4a8;
          }
          else {
            if ((long)local_42c._8_8_ < 0) {
              iVar5 = local_42c.bigend.vect[0] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4ac = -iVar5 / local_214 + -1;
            }
            else {
              local_4ac = local_42c.bigend.vect[0] / local_214;
            }
            local_20c = local_4ac;
          }
        }
        local_42c.bigend.vect[0] = local_20c;
        local_21c = local_42c.bigend.vect[1];
        local_220 = local_360[1];
        local_218 = local_21c;
        if (local_220 != 1) {
          if (local_220 == 2) {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4b4 = -iVar5 / 2 + -1;
            }
            else {
              local_4b4 = local_42c.bigend.vect[1] / 2;
            }
            local_218 = local_4b4;
          }
          else if (local_220 == 4) {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4b8 = -iVar5 / 4 + -1;
            }
            else {
              local_4b8 = local_42c.bigend.vect[1] / 4;
            }
            local_218 = local_4b8;
          }
          else {
            if (local_42c.bigend.vect[1] < 0) {
              iVar5 = local_42c.bigend.vect[1] + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4bc = -iVar5 / local_220 + -1;
            }
            else {
              local_4bc = local_42c.bigend.vect[1] / local_220;
            }
            local_218 = local_4bc;
          }
        }
        local_228 = local_42c.bigend.vect[2];
        local_42c.bigend.vect[1] = local_218;
        local_22c = local_360[2];
        local_224 = local_228;
        if (local_22c != 1) {
          if (local_22c == 2) {
            if ((long)uVar4 < 0) {
              iVar5 = local_228 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4c4 = -iVar5 / 2 + -1;
            }
            else {
              local_4c4 = local_228 / 2;
            }
            local_224 = local_4c4;
          }
          else if (local_22c == 4) {
            if ((long)uVar4 < 0) {
              iVar5 = local_228 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4c8 = -iVar5 / 4 + -1;
            }
            else {
              local_4c8 = local_228 / 4;
            }
            local_224 = local_4c8;
          }
          else {
            if ((long)uVar4 < 0) {
              iVar5 = local_228 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_4cc = -iVar5 / local_22c + -1;
            }
            else {
              local_4cc = local_228 / local_22c;
            }
            local_224 = local_4cc;
          }
        }
        local_42c.bigend.vect[2] = local_224;
        local_2b0 = &local_42c.bigend;
        local_2b8 = &local_36c;
        local_284 = 0;
        local_42c.bigend.vect[0] = local_36c.vect[0] + local_42c.bigend.vect[0];
        local_294 = 1;
        iVar5 = local_42c.bigend.vect[2];
        local_42c.bigend.vect[1] = local_36c.vect[1] + local_42c.bigend.vect[1];
        local_2a4 = 2;
        local_42c.bigend.vect[2] = local_36c.vect[2] + iVar5;
        local_42c._8_8_ = local_42c._8_8_;
        local_42c.bigend.vect._4_8_ = local_42c.bigend.vect._4_8_;
        local_2a0 = local_2b8;
        local_290 = local_2b8;
        local_280 = local_2b8;
      }
    }
    local_188 = local_3c8;
    local_170 = local_3c8;
    local_174 = 1;
    bVar6 = true;
    if ((*local_3c8 == 1) && (bVar6 = true, local_3c8[1] == 1)) {
      bVar6 = local_3c8[2] != 1;
    }
    local_180 = &local_42c;
    if (bVar6) {
      IntVect::IntVect(&local_194,1);
      local_98 = &local_42c.btype;
      IntVect::IntVect(&local_8c,local_42c.btype.itype & 1,local_42c.btype.itype >> 1 & 1,
                       local_42c.btype.itype >> 2 & 1);
      local_a0 = local_8c.vect[2];
      local_a8[0] = local_8c.vect[0];
      local_a8[1] = local_8c.vect[1];
      local_1a8 = local_8c.vect[2];
      local_1b0[0] = local_8c.vect[0];
      local_1b0[1] = local_8c.vect[1];
      local_1a0 = local_8c.vect[0];
      iStack_19c = local_8c.vect[1];
      uVar4 = _local_1a0;
      local_198 = local_8c.vect[2];
      local_e0 = &local_194;
      local_e8 = &local_1a0;
      local_b4 = 0;
      local_1a0 = local_8c.vect[0];
      local_194.vect[0] = local_194.vect[0] - local_1a0;
      local_c4 = 1;
      iStack_19c = local_8c.vect[1];
      local_194.vect[1] = local_194.vect[1] - iStack_19c;
      local_d4 = 2;
      local_194.vect[2] = local_194.vect[2] - local_8c.vect[2];
      local_40 = local_188;
      local_8 = local_188;
      local_c = 0;
      iVar5 = local_42c.smallend.vect[1];
      local_42c.smallend.vect[0] = *local_188 * local_42c.smallend.vect[0];
      local_18 = local_188;
      local_1c = 1;
      local_42c.smallend.vect[1] = local_188[1] * iVar5;
      local_28 = local_188;
      local_2c = 2;
      iVar5 = local_42c.bigend.vect[0];
      local_42c.smallend.vect[2] = local_188[2] * local_42c.smallend.vect[2];
      local_160 = &local_42c.bigend;
      local_168 = &local_194;
      local_134 = 0;
      local_42c.bigend.vect[0] = local_194.vect[0] + iVar5;
      local_144 = 1;
      iVar5 = local_42c.bigend.vect[2];
      local_42c.bigend.vect[1] = local_194.vect[1] + local_42c.bigend.vect[1];
      local_154 = 2;
      local_42c.bigend.vect[2] = local_194.vect[2] + iVar5;
      local_78 = &local_42c.bigend;
      local_80 = local_188;
      local_48 = local_188;
      local_4c = 0;
      local_42c.bigend.vect[0] = *local_188 * local_42c.bigend.vect[0];
      local_58 = local_188;
      local_5c = 1;
      iVar5 = local_42c.bigend.vect[2];
      local_42c.bigend.vect[1] = local_188[1] * local_42c.bigend.vect[1];
      local_68 = local_188;
      local_6c = 2;
      local_42c.bigend.vect[2] = local_188[2] * iVar5;
      local_120 = &local_42c.bigend;
      local_128 = &local_194;
      local_f4 = 0;
      local_42c.bigend.vect[0] = local_42c.bigend.vect[0] - local_194.vect[0];
      local_104 = 1;
      iVar5 = local_42c.bigend.vect[2];
      local_42c.bigend.vect[1] = local_42c.bigend.vect[1] - local_194.vect[1];
      local_114 = 2;
      local_42c.bigend.vect[2] = iVar5 - local_194.vect[2];
      _local_1a0 = uVar4;
      local_150 = local_168;
      local_140 = local_168;
      local_130 = local_168;
      local_110 = local_128;
      local_100 = local_128;
      local_f0 = local_128;
      local_d0 = local_e8;
      local_c0 = local_e8;
      local_b0 = local_e8;
      local_38 = &local_42c;
    }
    local_3b1 = operator==(in_RDI,&local_42c);
  }
  else {
    local_3b1 = false;
  }
  return local_3b1;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool coarsenable(const IntVect& refrat, const IntVect& min_width) const noexcept
    {
        if (!size().allGE(refrat*min_width)) {
            return false;
        } else {
            Box testBox = *this;
            testBox.coarsen(refrat);
            testBox.refine (refrat);
            return (*this == testBox);
        }
    }